

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O1

UniValue *
generateBlocks(UniValue *__return_storage_ptr__,ChainstateManager *chainman,Mining *miner,
              CScript *coinbase_script,int nGenerate,uint64_t nMaxTries)

{
  UniValue val;
  bool bVar1;
  UniValue *__return_storage_ptr___00;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> block_out;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  undefined4 in_stack_fffffffffffffec8;
  ChainstateManager *pCVar2;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 in_stack_fffffffffffffef8;
  CBlockTemplate *in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff10 [16];
  UniValue local_d0;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (nGenerate < 1) break;
    pCVar2 = chainman;
    bVar1 = util::SignalInterrupt::operator_cast_to_bool(chainman->m_interrupt);
    if (bVar1) break;
    local_78._M_dataplus._M_p._0_1_ = 1;
    local_78._M_string_length = 4000;
    local_78.field_2._M_allocated_capacity = 400;
    (*miner->_vptr_Mining[5])(&stack0xffffffffffffff00,miner,coinbase_script,&local_78);
    if (in_stack_ffffffffffffff00 == (CBlockTemplate *)0x0) {
      __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Couldn\'t create new block","");
      JSONRPCError(__return_storage_ptr___00,-0x7f5b,&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00334a1d;
    }
    this = (element_type *)0x0;
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar1 = GenerateBlock(chainman,miner,&in_stack_ffffffffffffff00->block,
                          (uint64_t *)&stack0xffffffffffffff08,
                          (shared_ptr<const_CBlock> *)&stack0xfffffffffffffee8,true);
    if ((bVar1) && (this != (element_type *)0x0)) {
      CBlockHeader::GetHash((uint256 *)&stack0xffffffffffffff10,&this->super_CBlockHeader);
      base_blob<256u>::GetHex_abi_cxx11_(&local_78,(uint256 *)&stack0xffffffffffffff10);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_d0,&local_78);
      val._4_4_ = nGenerate;
      val.typ = in_stack_fffffffffffffec8;
      val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      val.val._M_string_length = (size_type)pCVar2;
      val.val.field_2._M_allocated_capacity = (size_type)coinbase_script;
      val.val.field_2._8_8_ = this;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00._M_pi;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffef8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff00;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)nMaxTries;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff10._0_8_;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffff10._8_8_;
      UniValue::push_back(__return_storage_ptr__,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.val._M_dataplus._M_p != &local_d0.val.field_2) {
        operator_delete(local_d0.val._M_dataplus._M_p,local_d0.val.field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      nGenerate = nGenerate + -1;
    }
    chainman = pCVar2;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      chainman = pCVar2;
    }
    if (in_stack_ffffffffffffff00 != (CBlockTemplate *)0x0) {
      std::default_delete<node::CBlockTemplate>::operator()
                ((default_delete<node::CBlockTemplate> *)&stack0xffffffffffffff00,
                 in_stack_ffffffffffffff00);
    }
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00334a1d:
  __stack_chk_fail();
}

Assistant:

static UniValue generateBlocks(ChainstateManager& chainman, Mining& miner, const CScript& coinbase_script, int nGenerate, uint64_t nMaxTries)
{
    UniValue blockHashes(UniValue::VARR);
    while (nGenerate > 0 && !chainman.m_interrupt) {
        std::unique_ptr<CBlockTemplate> pblocktemplate(miner.createNewBlock(coinbase_script));
        if (!pblocktemplate.get())
            throw JSONRPCError(RPC_INTERNAL_ERROR, "Couldn't create new block");

        std::shared_ptr<const CBlock> block_out;
        if (!GenerateBlock(chainman, miner, pblocktemplate->block, nMaxTries, block_out, /*process_new_block=*/true)) {
            break;
        }

        if (block_out) {
            --nGenerate;
            blockHashes.push_back(block_out->GetHash().GetHex());
        }
    }
    return blockHashes;
}